

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-form.c
# Opt level: O0

size_t vstrnfmt(char *buf,size_t max,char *fmt,__va_list_tag *vp)

{
  uint uVar1;
  bool bVar2;
  byte *pbVar3;
  ushort **ppuVar4;
  size_t sVar5;
  long *local_e50;
  long *local_e38;
  undefined8 *local_e20;
  undefined8 *local_e08;
  uint *local_de8;
  undefined8 *local_dd0;
  uint *local_db8;
  undefined8 *local_da0;
  uint *local_d88;
  uint *local_d68;
  undefined8 *local_d50;
  char local_d38 [8];
  char arg2_1 [1024];
  char *local_930;
  char *arg_10;
  char arg2 [1024];
  wchar_t *local_520;
  wchar_t *arg_9;
  void *arg_8;
  double arg_7;
  uint arg_6;
  unsigned_long arg_5;
  wchar_t arg_4;
  long arg_3;
  wchar_t arg_2;
  wchar_t arg_1;
  size_t *arg;
  char tmp [1024];
  char aux [128];
  size_t q;
  size_t n;
  int local_40;
  int iStack_3c;
  _Bool do_long;
  wchar_t len;
  wchar_t i;
  char *s;
  __va_list_tag *vp_local;
  char *fmt_local;
  size_t max_local;
  char *buf_local;
  
  if (max == 0) {
    __assert_fail("max",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/z-form.c"
                  ,0xcd,"size_t vstrnfmt(char *, size_t, const char *, struct __va_list_tag *)");
  }
  if (fmt == (char *)0x0) {
    __assert_fail("fmt",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/z-form.c"
                  ,0xce,"size_t vstrnfmt(char *, size_t, const char *, struct __va_list_tag *)");
  }
  q = 0;
  _len = (byte *)fmt;
LAB_00288249:
  while (*_len != 0) {
    if (*_len == 0x25) {
      pbVar3 = _len + 1;
      if (*pbVar3 == 0x25) {
        if (q == max - 1) break;
        buf[q] = '%';
        q = q + 1;
        _len = _len + 2;
      }
      else {
        if (*pbVar3 != 0x6e) {
          aux[0x78] = '\x01';
          aux[0x79] = '\0';
          aux[0x7a] = '\0';
          aux[0x7b] = '\0';
          aux[0x7c] = '\0';
          aux[0x7d] = '\0';
          aux[0x7e] = '\0';
          aux[0x7f] = '\0';
          tmp[0x3f8] = '%';
          bVar2 = false;
          _len = pbVar3;
          do {
            if (*_len == 0) {
              *buf = '\0';
              return 0;
            }
            if (100 < (ulong)aux._120_8_) {
              *buf = '\0';
              return 0;
            }
            ppuVar4 = __ctype_b_loc();
            if (((*ppuVar4)[(int)(uint)*_len] & 0x400) == 0) {
              if (*_len == 0x2a) {
                uVar1 = vp->gp_offset;
                if (uVar1 < 0x29) {
                  local_d68 = (uint *)((long)(int)uVar1 + (long)vp->reg_save_area);
                  vp->gp_offset = uVar1 + 8;
                }
                else {
                  local_d68 = (uint *)vp->overflow_arg_area;
                  vp->overflow_arg_area = local_d68 + 2;
                }
                snprintf(tmp + aux._120_8_ + 0x3f8,0x80 - aux._120_8_,"%d",(ulong)*local_d68);
                for (; tmp[aux._120_8_ + 0x3f8] != '\0'; aux._120_8_ = aux._120_8_ + 1) {
                }
              }
              else {
                tmp[aux._120_8_ + 0x3f8] = *_len;
                aux._120_8_ = aux._120_8_ + 1;
              }
            }
            else {
              if (*_len != 0x6c) goto LAB_00288443;
              tmp[aux._120_8_ + 0x3f8] = *_len;
              bVar2 = true;
              aux._120_8_ = aux._120_8_ + 1;
            }
            _len = _len + 1;
          } while( true );
        }
        uVar1 = vp->gp_offset;
        if (uVar1 < 0x29) {
          local_d50 = (undefined8 *)((long)(int)uVar1 + (long)vp->reg_save_area);
          vp->gp_offset = uVar1 + 8;
        }
        else {
          local_d50 = (undefined8 *)vp->overflow_arg_area;
          vp->overflow_arg_area = local_d50 + 1;
        }
        *(size_t *)*local_d50 = q;
        _len = _len + 2;
      }
    }
    else {
      if (q == max - 1) break;
      buf[q] = *_len;
      q = q + 1;
      _len = _len + 1;
    }
  }
  buf[q] = '\0';
  return q;
LAB_00288443:
  pbVar3 = _len + 1;
  tmp[aux._120_8_ + 0x3f8] = *_len;
  tmp[aux._120_8_ + 0x3f9] = '\0';
  arg._0_1_ = 0;
  switch(tmp[aux._120_8_ + 0x3f8]) {
  case 'E':
  case 'G':
  case 'e':
  case 'f':
  case 'g':
    uVar1 = vp->fp_offset;
    if (uVar1 < 0xa1) {
      local_e08 = (undefined8 *)((long)(int)uVar1 + (long)vp->reg_save_area);
      vp->fp_offset = uVar1 + 0x10;
    }
    else {
      local_e08 = (undefined8 *)vp->overflow_arg_area;
      vp->overflow_arg_area = local_e08 + 1;
    }
    snprintf((char *)&arg,0x400,tmp + 0x3f8,*local_e08);
    break;
  default:
    *buf = '\0';
    return 0;
  case 'X':
  case 'o':
  case 'u':
  case 'x':
    if (bVar2) {
      uVar1 = vp->gp_offset;
      if (uVar1 < 0x29) {
        local_dd0 = (undefined8 *)((long)(int)uVar1 + (long)vp->reg_save_area);
        vp->gp_offset = uVar1 + 8;
      }
      else {
        local_dd0 = (undefined8 *)vp->overflow_arg_area;
        vp->overflow_arg_area = local_dd0 + 1;
      }
      snprintf((char *)&arg,0x400,tmp + 0x3f8,*local_dd0);
    }
    else {
      uVar1 = vp->gp_offset;
      if (uVar1 < 0x29) {
        local_de8 = (uint *)((long)(int)uVar1 + (long)vp->reg_save_area);
        vp->gp_offset = uVar1 + 8;
      }
      else {
        local_de8 = (uint *)vp->overflow_arg_area;
        vp->overflow_arg_area = local_de8 + 2;
      }
      snprintf((char *)&arg,0x400,tmp + 0x3f8,(ulong)*local_de8);
    }
    break;
  case 'c':
    uVar1 = vp->gp_offset;
    if (uVar1 < 0x29) {
      local_d88 = (uint *)((long)(int)uVar1 + (long)vp->reg_save_area);
      vp->gp_offset = uVar1 + 8;
    }
    else {
      local_d88 = (uint *)vp->overflow_arg_area;
      vp->overflow_arg_area = local_d88 + 2;
    }
    snprintf((char *)&arg,0x400,tmp + 0x3f8,(ulong)*local_d88);
    break;
  case 'd':
  case 'i':
    if (bVar2) {
      uVar1 = vp->gp_offset;
      if (uVar1 < 0x29) {
        local_da0 = (undefined8 *)((long)(int)uVar1 + (long)vp->reg_save_area);
        vp->gp_offset = uVar1 + 8;
      }
      else {
        local_da0 = (undefined8 *)vp->overflow_arg_area;
        vp->overflow_arg_area = local_da0 + 1;
      }
      snprintf((char *)&arg,0x400,tmp + 0x3f8,*local_da0);
    }
    else {
      uVar1 = vp->gp_offset;
      if (uVar1 < 0x29) {
        local_db8 = (uint *)((long)(int)uVar1 + (long)vp->reg_save_area);
        vp->gp_offset = uVar1 + 8;
      }
      else {
        local_db8 = (uint *)vp->overflow_arg_area;
        vp->overflow_arg_area = local_db8 + 2;
      }
      snprintf((char *)&arg,0x400,tmp + 0x3f8,(ulong)*local_db8);
    }
    break;
  case 'p':
    uVar1 = vp->gp_offset;
    if (uVar1 < 0x29) {
      local_e20 = (undefined8 *)((long)(int)uVar1 + (long)vp->reg_save_area);
      vp->gp_offset = uVar1 + 8;
    }
    else {
      local_e20 = (undefined8 *)vp->overflow_arg_area;
      vp->overflow_arg_area = local_e20 + 1;
    }
    snprintf((char *)&arg,0x400,tmp + 0x3f8,*local_e20);
    break;
  case 's':
    if (bVar2) {
      uVar1 = vp->gp_offset;
      if (uVar1 < 0x29) {
        local_e38 = (long *)((long)(int)uVar1 + (long)vp->reg_save_area);
        vp->gp_offset = uVar1 + 8;
      }
      else {
        local_e38 = (long *)vp->overflow_arg_area;
        vp->overflow_arg_area = local_e38 + 1;
      }
      local_520 = (wchar_t *)*local_e38;
      if (local_520 == (wchar_t *)0x0) {
        local_520 = L"";
      }
      sVar5 = text_wcslen(local_520);
      local_40 = (int)sVar5;
      if (0x2ff < local_40) {
        local_40 = 0x2ff;
      }
      for (iStack_3c = 0; iStack_3c < local_40; iStack_3c = iStack_3c + 1) {
        arg2[(long)iStack_3c + -8] = (char)local_520[iStack_3c];
      }
      arg2[(long)local_40 + -8] = '\0';
      tmp[aux._120_8_ + 0x3f7] = 's';
      tmp[aux._120_8_ + 0x3f8] = '\0';
      snprintf((char *)&arg,0x400,tmp + 0x3f8,&arg_10);
    }
    else {
      uVar1 = vp->gp_offset;
      if (uVar1 < 0x29) {
        local_e50 = (long *)((long)(int)uVar1 + (long)vp->reg_save_area);
        vp->gp_offset = uVar1 + 8;
      }
      else {
        local_e50 = (long *)vp->overflow_arg_area;
        vp->overflow_arg_area = local_e50 + 1;
      }
      local_930 = (char *)*local_e50;
      if (local_930 == (char *)0x0) {
        local_930 = "";
      }
      my_strcpy(local_d38,local_930,0x400);
      snprintf((char *)&arg,0x400,tmp + 0x3f8,local_d38);
    }
  }
  aux[0x78] = '\0';
  aux[0x79] = '\0';
  aux[0x7a] = '\0';
  aux[0x7b] = '\0';
  aux[0x7c] = '\0';
  aux[0x7d] = '\0';
  aux[0x7e] = '\0';
  aux[0x7f] = '\0';
  while ((_len = pbVar3, tmp[aux._120_8_ + -8] != '\0' && (q != max - 1))) {
    buf[q] = tmp[aux._120_8_ + -8];
    aux._120_8_ = aux._120_8_ + 1;
    q = q + 1;
  }
  goto LAB_00288249;
}

Assistant:

size_t vstrnfmt(char *buf, size_t max, const char *fmt, va_list vp)
{
	const char *s;
	int i = 0, len = 0;

	/* The argument is "long" */
	bool do_long;

	/* Bytes used in buffer */
	size_t n;

	/* Bytes used in format sequence */
	size_t q;

	/* Format sequence */
	char aux[128];

	/* Resulting string */
	char tmp[1024];

	assert(max);
	assert(fmt);

	/* Begin the buffer */
	n = 0;

	/* Begin the format string */
	s = fmt;

	/* Scan the format string */
	while (true) {
		/* All done */
		if (!*s) break;

		/* Normal character */
		if (*s != '%') {
			/* Check total length */
			if (n == max-1) break;

			/* Save the character */
			buf[n++] = *s++;

			/* Continue */
			continue;
		}

		/* Skip the "percent" */
		s++;

		/* Pre-process "%%" */
		if (*s == '%') {
			/* Check total length */
			if (n == max-1) break;

			/* Save the percent */
			buf[n++] = '%';

			/* Skip the "%" */
			s++;

			/* Continue */
			continue;
		}

		/* Pre-process "%n" */
		if (*s == 'n') {
			size_t *arg;

			/* Get the next argument */
			arg = va_arg(vp, size_t *);

			/* Save the current length */
			(*arg) = n;

			/* Skip the "n" */
			s++;

			/* Continue */
			continue;
		}


		/* Begin the "aux" string */
		q = 0;

		/* Save the "percent" */
		aux[q++] = '%';

		do_long = false;

		/* Build the "aux" string */
		while (true) {
			/* Error -- format sequence is not terminated */
			if (!*s) {
				/* Terminate the buffer */
				buf[0] = '\0';

				/* Return "error" */
				return (0);
			}

			/* Error -- format sequence may be too long */
			if (q > 100) {
				/* Terminate the buffer */
				buf[0] = '\0';

				/* Return "error" */
				return (0);
			}

			/* Handle "alphabetic" or "non-alphabetic"chars */
			if (isalpha((unsigned char)*s)) {
				/* Hack -- handle "long" request */
				if (*s == 'l') {
					/* Save the character */
					aux[q++] = *s++;

					/* Note the "long" flag */
					do_long = true;
				} else {
					/* Save the character */
					aux[q++] = *s++;

					/* Stop processing the format sequence */
					break;
				}
			} else {
				/* Hack -- Handle 'star' (for "variable length" argument) */
				if (*s == '*') {
					int arg;

					/* Get the next argument */
					arg = va_arg(vp, int);

					/* Hack -- append the "length" */
					snprintf(aux + q, sizeof(aux) - q, "%d", arg);

					/* Hack -- accept the "length" */
					while (aux[q]) q++;

					/* Skip the "*" */
					s++;
				} else {
					/* Save the normal character (digits, "-", "+", ".", etc) */
					aux[q++] = *s++;
				}
			}
		}

		/* Terminate "aux" */
		aux[q] = '\0';

		/* Clear "tmp" */
		tmp[0] = '\0';

		/* Process the "format" symbol */
		switch (aux[q - 1]) {
			/* Simple Character -- standard format */
			case 'c':
			{
				int arg;

				/* Get the next argument */
				arg = va_arg(vp, int);

				/* Format the argument */
				snprintf(tmp, sizeof(tmp), aux, arg);

				/* Done */
				break;
			}

			/* Signed Integers -- standard format */
			case 'd': case 'i':
			{
				if (do_long) {
					long arg;

					/* Get the next argument */
					arg = va_arg(vp, long);

					/* Format the argument */
					snprintf(tmp, sizeof(tmp), aux, arg);
				} else {
					int arg;

					/* Get the next argument */
					arg = va_arg(vp, int);

					/* Format the argument */
					snprintf(tmp, sizeof(tmp), aux, arg);
				}

				/* Done */
				break;
			}

			/* Unsigned Integers -- various formats */
			case 'u': case 'o': case 'x': case 'X':
			{
				if (do_long) {
					unsigned long arg;

					/* Get the next argument */
					arg = va_arg(vp, unsigned long);

					/* Format the argument */
					snprintf(tmp, sizeof(tmp), aux, arg);
				} else {
					unsigned int arg;

					/* Get the next argument */
					arg = va_arg(vp, unsigned int);

					/* Format the argument */
					snprintf(tmp, sizeof(tmp), aux, arg);
				}

				/* Done */
				break;
			}

			/* Floating Point -- various formats */
			case 'f':
			case 'e': case 'E':
			case 'g': case 'G':
			{
				double arg;

				/* Get the next argument */
				arg = va_arg(vp, double);

				/* Format the argument */
				snprintf(tmp, sizeof(tmp), aux, arg);

				/* Done */
				break;
			}

			/* Pointer -- implementation varies */
			case 'p':
			{
				void *arg;

				/* Get the next argument */
				arg = va_arg(vp, void*);

				/* Format the argument */
				snprintf(tmp, sizeof(tmp), aux, arg);

				/* Done */
				break;
			}

			/* String */
			case 's':
			{
				if (do_long) {
					const wchar_t *arg;
					char arg2[1024];

					/* XXX There is a big bug here: if one
					 * passes "%.0s" to strnfmt, then really we
					 * should not dereference the arg at all.
					 * But it does.  See bug #666.
					 */

					/* Get the next argument */
					arg = va_arg(vp, const wchar_t *);

					/* Hack -- convert NULL to EMPTY */
					if (!arg) arg = L"";

					/* Prevent buffer overflows and convert string to char */
					/* this really should use a wcstombs type function */
					len = text_wcslen(arg);
					if (len >= 768) {
						len = 767;
					}
					for (i = 0; i < len; ++i) {
						arg2[i] = (char)arg[i];
					}
					arg2[len] = '\0';

					/* Remove the l from aux, since we no longer have wchar_t
					 * as input */
					aux[q-2] = 's';
					aux[q-1] = '\0';

					/* Format the argument */
					snprintf(tmp, sizeof(tmp), aux, arg2);

					/* Done */
					break;
				} else {
					const char *arg;
					char arg2[1024];

					/* XXX There is a big bug here: if one
					 * passes "%.0s" to strnfmt, then really we
					 * should not dereference the arg at all.
					 * But it does.  See bug #666.
					 */

					/* Get the next argument */
					arg = va_arg(vp, const char *);

					/* Hack -- convert NULL to EMPTY */
					if (!arg) arg = "";

					/* Prevent buffer overflows */
					(void)my_strcpy(arg2, arg, sizeof(arg2));

					/* Format the argument */
					snprintf(tmp, sizeof(tmp), aux, arg2);

					/* Done */
					break;
				}
			}

			/* Oops */
			default:
			{
				/* Error -- illegal format char */
				buf[0] = '\0';

				/* Return "error" */
				return (0);
			}
		}

		/* Now append "tmp" to "buf" */
		for (q = 0; tmp[q]; q++) {
			/* Check total length */
			if (n == max-1) break;

			/* Save the character */
			buf[n++] = tmp[q];
		}
	}


	/* Terminate buffer */
	buf[n] = '\0';

	/* Return length */
	return (n);
}